

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overlay.cpp
# Opt level: O2

void __thiscall r_exec::Overlay::load_code(Overlay *this)

{
  Atom *pAVar1;
  ushort uVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong *puVar5;
  void *__src;
  Atom *this_00;
  long lVar6;
  long *plVar4;
  
  pAVar1 = this->code;
  if (pAVar1 != (Atom *)0x0) {
    if (*(long *)(pAVar1 + -8) != 0) {
      lVar6 = *(long *)(pAVar1 + -8) << 2;
      do {
        r_code::Atom::~Atom(pAVar1 + lVar6 + -4);
        lVar6 = lVar6 + -4;
      } while (lVar6 != 0);
    }
    operator_delete__(pAVar1 + -8);
  }
  iVar3 = (*(this->controller->super__Object)._vptr__Object[4])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  uVar2 = (**(code **)(*plVar4 + 0x30))(plVar4);
  this->code_size = uVar2;
  puVar5 = (ulong *)operator_new__((ulong)uVar2 * 4 + 8);
  *puVar5 = (ulong)uVar2;
  pAVar1 = (Atom *)(puVar5 + 1);
  if (uVar2 != 0) {
    lVar6 = 0;
    this_00 = pAVar1;
    do {
      r_code::Atom::Atom(this_00,0xffffffff);
      lVar6 = lVar6 + -4;
      this_00 = this_00 + 4;
    } while (-lVar6 != (ulong)((uint)uVar2 * 4));
  }
  this->code = pAVar1;
  __src = (void *)(**(code **)(*plVar4 + 0x20))(plVar4,0);
  memcpy(pAVar1,__src,(ulong)this->code_size << 2);
  return;
}

Assistant:

void Overlay::load_code()
{
    if (code) {
        delete[] code;
    }

    Code *object = get_core_object();
    // copy the original pgm/hlp code.
    code_size = object->code_size();
    code = new r_code::Atom[code_size];
    memcpy(code, &object->code(0), code_size * sizeof(r_code::Atom));
}